

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int MlmWrap::handle_mlm_msgpipe(zloop_t *loop,zsock_t *reader,void *arg)

{
  int iVar1;
  zmsg_t *msg;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_R8;
  
  msg = (zmsg_t *)mlm_client_recv(*(undefined8 *)((long)arg + 0x30));
  pcVar2 = (char *)mlm_client_command(*(undefined8 *)((long)arg + 0x30));
  pcVar4 = "STREAM DELIVER";
  iVar1 = strcmp(pcVar2,"STREAM DELIVER");
  if (iVar1 == 0) {
    mlm_client_address(*(undefined8 *)((long)arg + 0x30));
    pcVar2 = (char *)mlm_client_sender(*(undefined8 *)((long)arg + 0x30));
    pcVar3 = (char *)mlm_client_subject(*(undefined8 *)((long)arg + 0x30));
    route_stream_msgs((MlmWrap *)arg,pcVar4,pcVar2,pcVar3,msg);
  }
  else {
    pcVar4 = "MAILBOX DELIVER";
    iVar1 = strcmp(pcVar2,"MAILBOX DELIVER");
    if (iVar1 == 0) {
      mlm_client_address(*(undefined8 *)((long)arg + 0x30));
      pcVar2 = (char *)mlm_client_sender(*(undefined8 *)((long)arg + 0x30));
      pcVar3 = (char *)mlm_client_subject(*(undefined8 *)((long)arg + 0x30));
      mlm_client_tracker(*(undefined8 *)((long)arg + 0x30));
      route_mailbox_msgs((MlmWrap *)arg,pcVar4,pcVar2,pcVar3,in_R8,msg);
    }
    else {
      pcVar4 = "SERVICE DELIVER";
      iVar1 = strcmp(pcVar2,"SERVICE DELIVER");
      if (iVar1 == 0) {
        mlm_client_address(*(undefined8 *)((long)arg + 0x30));
        pcVar2 = (char *)mlm_client_sender(*(undefined8 *)((long)arg + 0x30));
        pcVar3 = (char *)mlm_client_subject(*(undefined8 *)((long)arg + 0x30));
        mlm_client_tracker(*(undefined8 *)((long)arg + 0x30));
        route_service_msgs((MlmWrap *)arg,pcVar4,pcVar2,pcVar3,in_R8,msg);
      }
    }
  }
  return 0;
}

Assistant:

int MlmWrap::handle_mlm_msgpipe(zloop_t *loop, zsock_t *reader, void *arg){
    MlmWrap *self = (MlmWrap*)arg;
    zmsg_t *msg = mlm_client_recv(self->client);
    const char *cmd = mlm_client_command(self->client);
    if(streq(cmd, "STREAM DELIVER")){
        return self->route_stream_msgs(mlm_client_address(self->client),
                mlm_client_sender(self->client),
                mlm_client_subject(self->client),
                msg);
    }
    else if(streq(cmd, "MAILBOX DELIVER")){
        return self->route_mailbox_msgs(mlm_client_address(self->client),
                mlm_client_sender(self->client),
                mlm_client_subject(self->client),
                mlm_client_tracker(self->client),
                msg);
    }
    else if(streq(cmd, "SERVICE DELIVER")){
        return self->route_service_msgs(mlm_client_address(self->client),
                mlm_client_sender(self->client),
                mlm_client_subject(self->client),
                mlm_client_tracker(self->client),
                msg);
    }
    else{
        //Todo: Throw error? who would catch it, not zloop
        return 0;
    }
    return 0;
}